

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O0

int __thiscall
kstream<gzFile_s_*,_FunctorZlib>::readFastq(kstream<gzFile_s_*,_FunctorZlib> *this,kseq *seq)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  FILE *in_RSI;
  FILE *__stream;
  kseq *in_RDI;
  undefined1 uVar5;
  bool bVar6;
  bool good;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined7 in_stack_ffffffffffffffe0;
  int local_4;
  
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  if (*(int *)&in_RDI->name == 10) {
    iVar1 = getName((kstream<gzFile_s_*,_FunctorZlib> *)in_RDI,
                    (kseq *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    if (iVar1 == -1) {
      if (*(int *)((long)&(in_RDI->name).field_2 + 8) == 1) {
        local_4 = -2;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: Unexpected ID after ");
        poVar2 = std::operator<<(poVar2,(string *)in_RSI);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_4 = -3;
      }
    }
    else {
      uVar5 = *(int *)&in_RDI->name == 10;
      if ((bool)uVar5) {
        __stream = in_RSI;
        getSeq((kstream<gzFile_s_*,_FunctorZlib> *)CONCAT17(uVar5,in_stack_ffffffffffffffe0),in_RDI)
        ;
        if (*(int *)&in_RDI->name == 0x2b) {
          do {
            iVar1 = getc((kstream<gzFile_s_*,_FunctorZlib> *)in_RDI,__stream);
            *(int *)&in_RDI->name = iVar1;
            bVar6 = false;
            if (iVar1 != -1) {
              bVar6 = *(int *)&in_RDI->name != 10;
            }
          } while (bVar6);
          if (*(int *)&in_RDI->name == -1) {
            poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: File ended unexpectedly on ID ");
            poVar2 = std::operator<<(poVar2,(string *)in_RSI);
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            local_4 = -3;
          }
          else {
            getQual((kstream<gzFile_s_*,_FunctorZlib> *)CONCAT17(uVar5,in_stack_ffffffffffffffe0),
                    in_RDI);
            if (*(int *)&in_RDI->name == 10) {
              lVar3 = std::__cxx11::string::length();
              lVar4 = std::__cxx11::string::length();
              if (lVar3 == lVar4) {
                local_4 = std::__cxx11::string::length();
              }
              else {
                poVar2 = std::operator<<((ostream *)&std::cerr,
                                         "ERROR: The length of the sequence doesn\'t match the quality for ID "
                                        );
                poVar2 = std::operator<<(poVar2,(string *)in_RSI);
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                local_4 = -3;
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cerr,
                                       "ERROR: The quality string appears to be longer for ID ");
              poVar2 = std::operator<<(poVar2,(string *)in_RSI);
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              local_4 = -3;
            }
          }
        }
        else {
          local_4 = std::__cxx11::string::length();
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "ERROR: There must have been a problem reading the ID of ");
        poVar2 = std::operator<<(poVar2,(string *)in_RSI);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_4 = -3;
      }
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "ERROR: Unexpected record start, last valid record: ");
    poVar2 = std::operator<<(poVar2,(string *)in_RSI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int readFastq(kseq& seq) {
        seq.comment.clear();
        seq.seq.clear();
        seq.qual.clear();

        if (c != '\n') {
            std::cerr << "ERROR: Unexpected record start, last valid record: " << seq.name << std::endl;
            return -3;
        }

        if (getName(seq) == -1) {
            if (is_eof != 1) {
                std::cerr << "ERROR: Unexpected ID after " << seq.name << std::endl;
                return -3;
            } else {
                return -2;
            }
        }

        bool good(false);
        switch(c){
            case 10:    // new line character
                good = true;
                break;
        }
        if (!good) {
            std::cerr << "ERROR: There must have been a problem reading the ID of " << seq.name << std::endl;
            return -3;
        }

        getSeq(seq);
        if (c != '+') {
            return (int)seq.seq.length();
        }
        while ((c = this->getc()) != -1 && c != '\n');  // Ignore whatever comes after '+'

        if (c == -1) {
            std::cerr << "ERROR: File ended unexpectedly on ID " << seq.name << std::endl;
            return -3; // File ended unexpectedly
        }

        getQual(seq);
        if (c != '\n') {
            std::cerr << "ERROR: The quality string appears to be longer for ID " << seq.name << std::endl;
            return -3;
        }
        if (seq.seq.length() != seq.qual.length()) {
            std::cerr << "ERROR: The length of the sequence doesn't match the quality for ID " << seq.name << std::endl;
            return -3;
        }
        return (int)seq.seq.length();
    }